

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::AssertionPrinter::printSourceInfo(AssertionPrinter *this)

{
  ostream *poVar1;
  SourceLineInfo *this_00;
  SourceLineInfo SStack_38;
  
  this_00 = &SStack_38;
  (**(code **)(*Colour::impl + 0x10))(Colour::impl,0x17);
  poVar1 = this->stream;
  SourceLineInfo::SourceLineInfo(&SStack_38,&(this->result->m_info).lineInfo);
  poVar1 = operator<<(poVar1,&SStack_38);
  std::operator<<(poVar1,": ");
  std::__cxx11::string::~string((string *)&SStack_38);
  Colour::~Colour((Colour *)this_00);
  return;
}

Assistant:

void printSourceInfo() const {
                Colour colourGuard( Colour::FileName );
                stream << result.getSourceInfo() << ": ";
            }